

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RemoveTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *pAVar2;
  DObject *this;
  int flags;
  char *pcVar3;
  PClassActor *filter;
  VMValue *pVVar4;
  FName local_34;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003ef077;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ef05e:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ef077:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1846,
                  "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_003eef7f;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ef077;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_003ef05e;
LAB_003eef7f:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pVVar4 = defaultparam->Array;
    if (pVVar4[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ef0be:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1847,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = pVVar4[1].field_0.i;
LAB_003eefe3:
    if (pVVar4[2].field_0.field_3.Type != '\x03') {
LAB_003ef067:
      pcVar3 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ef0dd:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1848,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)pVVar4[2].field_0.field_1.a;
    if (pVVar4[2].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003ef067;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ef0be;
    }
    flags = param[1].field_0.i;
    if ((uint)numparam < 3) {
      pVVar4 = defaultparam->Array;
      goto LAB_003eefe3;
    }
    if ((param[2].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[2].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[2].field_0.field_1.atag != 1)) {
      pcVar3 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ef0dd;
    }
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ef096;
      }
      goto LAB_003ef008;
    }
    pVVar4 = defaultparam->Array;
  }
  if (pVVar4[3].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ef096:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1849,
                  "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ef008:
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)(this + 0xd));
  if (pAVar2 != (AActor *)0x0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)(this + 0xd));
    DoRemove(pAVar2,flags,filter,&local_34);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	if (self->target != NULL)
	{
		DoRemove(self->target, flags, filter, species);
	}
	return 0;
}